

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QString,_QString>_>::reallocate
          (QMovableArrayOps<std::pair<QString,_QString>_> *this,qsizetype alloc,
          AllocationOption option)

{
  long lVar1;
  AllocationOption in_EDX;
  qsizetype in_RSI;
  pair<QString,_QString> *in_RDI;
  long in_FS_OFFSET;
  pair<QTypedArrayData<std::pair<QString,_QString>_>_*,_std::pair<QString,_QString>_*> pVar2;
  pair<QTypedArrayData<std::pair<QString,_QString>_>_*,_std::pair<QString,_QString>_*> pair;
  pair<QString,_QString> *ppStack_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVar2 = QTypedArrayData<std::pair<QString,_QString>_>::reallocateUnaligned
                    ((QTypedArrayData<std::pair<QString,_QString>_> *)0xaaaaaaaaaaaaaaaa,in_RDI,
                     in_RSI,in_EDX);
  qt_noop();
  (in_RDI->first).d.d = (Data *)pVar2.first;
  ppStack_10 = pVar2.second;
  (in_RDI->first).d.ptr = (char16_t *)ppStack_10;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }